

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool __thiscall
ON_SubDFace::RemoveEdgeFromArray(ON_SubDFace *this,uint i,ON_SubDEdgePtr *removed_edge)

{
  ushort uVar1;
  bool bVar2;
  ON_SubDEdgePtr *pOVar3;
  ON_SubDEdgePtr *pOVar4;
  uint uVar5;
  ON_SubDEdgePtr *pOVar6;
  
  removed_edge->m_ptr = (ON__UINT_PTR)(ON_SubDEdgePtr)0x0;
  uVar1 = this->m_edge_count;
  if (i < uVar1) {
    if (i < 4) {
      removed_edge->m_ptr = this->m_edge4[i].m_ptr;
    }
    if (4 < uVar1) {
      if ((this->m_edgex == (ON_SubDEdgePtr *)0x0) || (this->m_edgex_capacity + 4 < (uint)uVar1))
      goto LAB_005d8558;
      if (3 < i) {
        removed_edge->m_ptr = this->m_edgex[(long)(int)i + -4].m_ptr;
      }
    }
    if (i + 1 < (uint)uVar1) {
      pOVar3 = this->m_edge4 + (int)(i + 1);
      do {
        pOVar4 = this->m_edgex + (long)(int)i + -3;
        if (i < 3) {
          pOVar4 = pOVar3;
        }
        pOVar6 = this->m_edge4 + i;
        if (3 < i) {
          pOVar6 = this->m_edgex + (i - 4);
        }
        pOVar6->m_ptr = pOVar4->m_ptr;
        pOVar3 = pOVar3 + 1;
        uVar5 = i + 2;
        i = i + 1;
      } while (uVar5 < uVar1);
    }
    this->m_edge_count = uVar1 - 1;
    bVar2 = true;
  }
  else {
LAB_005d8558:
    ON_SubDIncrementErrorCount();
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ON_SubDFace::RemoveEdgeFromArray(
  unsigned int i,
  ON_SubDEdgePtr& removed_edge
  )
{
  removed_edge = ON_SubDEdgePtr::Null;
  unsigned int count = m_edge_count;
  if ( i >= count )
    return ON_SUBD_RETURN_ERROR(false);
  if (i < 4)
  {
    removed_edge = m_edge4[i];
  }
  if (count > 4)
  {
    if ( nullptr == m_edgex || m_edgex_capacity + ((unsigned short)4) < m_edge_count )
      return ON_SUBD_RETURN_ERROR(false);
    if ( i >= 4 )
      removed_edge = m_edgex[i-4];
  }

  unsigned int j = i+1;

  while (j < count)
  {
    const ON_SubDEdgePtr& edge_j = j < 4 ? m_edge4[j] : m_edgex[j - 4];
    if (i < 4)
      m_edge4[i] = edge_j;
    else
      m_edgex[i - 4] = edge_j;
    i++;
    j++;
  }

  m_edge_count--;

  return true;
}